

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quic_unacked_packet_map.cc
# Opt level: O0

void __thiscall
quic::QuicUnackedPacketMap::PickLostPackets
          (QuicUnackedPacketMap *this,list<unsigned_short,_std::allocator<unsigned_short>_> *packets
          ,uint16_t latest_number)

{
  bool bVar1;
  value_type_conflict local_22;
  int local_20;
  uint16_t local_1a;
  int32_t sequence_number;
  uint16_t latest_number_local;
  list<unsigned_short,_std::allocator<unsigned_short>_> *packets_local;
  QuicUnackedPacketMap *this_local;
  
  local_1a = latest_number;
  _sequence_number = packets;
  packets_local = (list<unsigned_short,_std::allocator<unsigned_short>_> *)this;
  bVar1 = IsNewer<unsigned_short>(this->_least_unack_packet_number,latest_number);
  if (!bVar1) {
    local_20 = -1;
    while (bVar1 = IsNewer<unsigned_short>(local_1a,this->_least_unack_packet_number), bVar1) {
      local_20 = this->_unack_sequence_numbers[this->_least_unack_packet_number];
      if (local_20 != -1) {
        local_22 = (value_type_conflict)local_20;
        std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                  (_sequence_number,&local_22);
        ReduceInflightPacket(this,local_20);
        this->_unack_sequence_numbers[this->_least_unack_packet_number] = -1;
      }
      this->_least_unack_packet_number = this->_least_unack_packet_number + 1;
    }
    this->_least_unack_packet_number = local_1a;
  }
  return;
}

Assistant:

void QuicUnackedPacketMap::PickLostPackets(std::list<uint16_t> &packets, uint16_t latest_number)
	{
		if (IsNewer(_least_unack_packet_number, latest_number))
			return;
		int32_t sequence_number = -1;
		while (IsNewer(latest_number, _least_unack_packet_number)) {
			sequence_number = _unack_sequence_numbers[_least_unack_packet_number];
			if (sequence_number != -1) {
				packets.push_back(sequence_number);
#ifdef OUTPUT_VERBOSE_INFO
				dd::OutputDebugInfo("PickLostPackets packet lost, packet number = %d, sequence number = %d\r\n",
					_least_unack_packet_number, sequence_number);
#endif

				ReduceInflightPacket(sequence_number);
				_unack_sequence_numbers[_least_unack_packet_number] = -1;
			}

			_least_unack_packet_number++;

#ifdef OUTPUT_VERBOSE_INFO
			dd::OutputDebugInfo("PickLostPackets _unack_sequence_numbers[%d] = -1\r\n", _least_unack_packet_number);
#endif
		}
		_least_unack_packet_number = latest_number;

#ifdef OUTPUT_VERBOSE_INFO
		dd::OutputDebugInfo("PickLostPackets set _least_unack_packet_number = %d\r\n", _least_unack_packet_number);
#endif
	}